

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  unsigned_short *puVar2;
  uint local_1c;
  byte local_15;
  int idx_local;
  ImGuiInputTextState *obj_local;
  
  if (idx < 1) {
    local_1c = 1;
  }
  else {
    puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx + -1);
    bVar1 = is_separator((uint)*puVar2);
    local_15 = 0;
    if (bVar1) {
      puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx);
      bVar1 = is_separator((uint)*puVar2);
      local_15 = bVar1 ^ 0xff;
    }
    local_1c = (uint)(local_15 & 1);
  }
  return local_1c;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator( obj->TextW[idx-1] ) && !is_separator( obj->TextW[idx] ) ) : 1; }